

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flate.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  if (argc == 2) {
    run(argv[1]);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: pipeline filename");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "Usage: pipeline filename" << std::endl;
        exit(2);
    }
    char* filename = argv[1];

    try {
        run(filename);
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
    }
    return 0;
}